

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O2

int check_host(char *hostname,void *sin_addr)

{
  int iVar1;
  undefined8 in_RAX;
  hostent *phVar2;
  in_addr addr;
  
  addr.s_addr = (in_addr_t)((ulong)in_RAX >> 0x20);
  phVar2 = gethostbyname(hostname);
  if (phVar2 == (hostent *)0x0) {
    iVar1 = inet_pton(2,hostname,&addr);
    if (iVar1 == 0) {
      return 0;
    }
    *(in_addr_t *)sin_addr = addr.s_addr;
  }
  else {
    memcpy(sin_addr,*phVar2->h_addr_list,(long)phVar2->h_length);
  }
  return 1;
}

Assistant:

static int
check_host(char *hostname, void *sin_addr)
{
    struct hostent *host_addr;
    host_addr = gethostbyname(hostname);
    if (host_addr == NULL) {
	struct in_addr addr;
	if (inet_pton(PF_INET, hostname, &addr) == 0) {
//	if (inet_aton(hostname, &addr) == 0) {
	    /* 
	     *  not translatable as a hostname or 
	     * as a dot-style string IP address
	     */
	    return 0;
	}
	assert(sizeof(int) == sizeof(struct in_addr));
	*((int *) sin_addr) = *((int*) &addr);
    } else {
	memcpy(sin_addr, host_addr->h_addr, host_addr->h_length);
    }
    return 1;
}